

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::yml::Parser::_apply_chomp(Parser *this,substr buf,size_t *pos,BlockChomp_e chomp)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  error_flags eVar5;
  ulong *in_RCX;
  ulong in_RDX;
  char *in_RDI;
  int in_R8D;
  basic_substring<char> bVar6;
  bool added_newline;
  substr trimmed;
  Parser *in_stack_00000400;
  csubstr in_stack_00000408;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_substring<char> *this_00;
  basic_substring<char_const> local_90 [23];
  bool local_79;
  undefined8 local_78;
  basic_substring<char> *in_stack_ffffffffffffff98;
  ulong local_60;
  basic_substring<char> local_40;
  char *local_30;
  undefined4 local_28;
  ulong local_20;
  basic_substring<char> *local_18;
  undefined8 local_10;
  undefined8 local_8;
  char cStack_1;
  
  local_20 = *in_RCX;
  this_00 = &local_40;
  local_18 = this_00;
  if (in_RDX < local_20 && local_20 != 0xffffffffffffffff) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) &&
       (in_stack_ffffffffffffff57 = is_debugger_attached(), (bool)in_stack_ffffffffffffff57)) {
      trap_instruction();
    }
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x154e;
    handle_error(0x347f4b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
  }
  basic_substring<char>::basic_substring
            (this_00,in_RDI,CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  local_78 = local_10;
  bVar6 = basic_substring<char>::trimr(in_stack_ffffffffffffff98,cStack_1);
  local_79 = false;
  local_60 = bVar6.len;
  if (in_R8D == 0) {
    uVar1 = *in_RCX;
    if (local_60 != uVar1) {
      *in_RCX = local_60 + 1;
    }
    else {
      lVar2 = *(long *)(in_RDI + 0xa78);
      uVar3 = *in_RCX;
      *in_RCX = uVar3 + 1;
      *(undefined1 *)(lVar2 + uVar3) = 10;
    }
    local_79 = local_60 == uVar1;
  }
  else if (in_R8D == 1) {
    *in_RCX = local_60;
  }
  else if (in_R8D == 2) {
    local_79 = local_60 == *in_RCX;
  }
  else {
    bVar4 = is_debugger_attached();
    if ((bVar4) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    basic_substring<char_const>::basic_substring<27ul>
              (local_90,(char (*) [27])"ERROR: unknown chomp style");
    _err<>(in_stack_00000400,in_stack_00000408);
  }
  return (bool)(local_79 & 1);
}

Assistant:

bool Parser::_apply_chomp(substr buf, size_t *C4_RESTRICT pos, BlockChomp_e chomp)
{
    substr trimmed = buf.first(*pos).trimr('\n');
    bool added_newline = false;
    switch(chomp)
    {
    case CHOMP_KEEP:
        if(trimmed.len == *pos)
        {
            _c4dbgpf("chomp=KEEP: add missing newline @{}", *pos);
            //m_filter_arena.str[(*pos)++] = '\n';
            added_newline = true;
        }
        break;
    case CHOMP_CLIP:
        if(trimmed.len == *pos)
        {
            _c4dbgpf("chomp=CLIP: add missing newline @{}", *pos);
            m_filter_arena.str[(*pos)++] = '\n';
            added_newline = true;
        }
        else
        {
            _c4dbgpf("chomp=CLIP: include single trailing newline @{}", trimmed.len+1);
            *pos = trimmed.len + 1;
        }
        break;
    case CHOMP_STRIP:
        _c4dbgpf("chomp=STRIP: strip {}-{}-{} newlines", *pos, trimmed.len, *pos-trimmed.len);
        *pos = trimmed.len;
        break;
    default:
        _c4err("unknown chomp style");
    }
    return added_newline;
}